

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ostream *poVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint i;
  int iVar9;
  bool bVar10;
  string filename;
  string local_258;
  ifstream in;
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&filename,argv[1],(allocator *)&in);
    std::ifstream::ifstream(&in);
    std::ifstream::open((char *)&in,(_Ios_Openmode)filename._M_dataplus._M_p);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar5 = std::operator<<((ostream *)&std::cout,"Can\'t open file: ");
      poVar5 = std::operator<<(poVar5,(string *)&filename);
      std::endl<char,std::char_traits<char>>(poVar5);
LAB_00102948:
      iVar9 = 1;
    }
    else {
      readUINT32(&in);
      readUINT32(&in);
      readUINT32(&in);
      readUINT32(&in);
      readUINT32(&in);
      readUINT32(&in);
      readUINT32(&in);
      readUINT32(&in);
      uVar2 = readUINT32(&in);
      readUINT32(&in);
      uVar3 = readUINT32(&in);
      uVar6 = uVar3 >> 1 & 1;
      uVar8 = uVar6 ^ 1;
      if ((uVar3 & 4) == 0) {
        uVar8 = 2 - uVar6;
      }
      iVar7 = uVar8 + ((uVar3 & 8) == 0);
      readUINT32(&in);
      uVar3 = readUINT32(&in);
      readUINT32(&in);
      readUINT32(&in);
      iVar9 = 0x2c;
      while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
        readUINT32(&in);
      }
      while (bVar10 = uVar3 != 0, uVar3 = uVar3 - 1, bVar10) {
        readUINT32(&in);
      }
      while (bVar10 = uVar2 != 0, uVar2 = uVar2 - 1, bVar10) {
        readUINT32(&in);
      }
      iVar9 = iVar7 * 10000;
      while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
        readUINT32(&in);
      }
      for (iVar9 = 0; iVar9 != 5; iVar9 = iVar9 + 1) {
        uVar2 = readUINT32(&in);
        if (uVar2 != 0) {
          uVar3 = 0;
          for (uVar8 = 0; uVar8 = uVar8 & 0xffff,
              (int)uVar8 < (int)((int)(short)((short)uVar2 + 0xf) & 0xfffffff0U); uVar8 = uVar8 + 1)
          {
            uVar4 = readUINT32(&in);
            readUINT32(&in);
            if (uVar4 >> 0x18 == 1) {
              readUINT32(&in);
LAB_0010283a:
              readUINT32(&in);
            }
            else if (uVar4 >> 0x18 == 2) goto LAB_0010283a;
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            readUINT32(&in);
            if ((~uVar8 & 0xf) == 0) {
              uVar4 = readUINT32(&in);
              readUINT32(&in);
              uVar3 = uVar3 + uVar4;
            }
          }
          if (uVar3 != uVar2) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Check error!");
            std::endl<char,std::char_traits<char>>(poVar5);
            goto LAB_00102948;
          }
        }
      }
      readUINT32(&in);
      for (iVar9 = 0; iVar9 != iVar7; iVar9 = iVar9 + 1) {
        uVar2 = readUINT32(&in);
        while (bVar10 = uVar2 != 0, uVar2 = uVar2 - 1, bVar10) {
          readObject(&in);
        }
      }
      iVar9 = 0;
      std::ifstream::close();
    }
    std::ifstream::~ifstream(&in);
    std::__cxx11::string::~string((string *)&filename);
  }
  else {
    std::__cxx11::string::string((string *)&local_258,*argv,(allocator *)&in);
    usage(&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        usage(argv[0]);
        return 1;
    }

    std::string filename = argv[1];
    std::ifstream in;

    in.open(filename.c_str(), std::ios_base::binary | std::ios_base::in);
    if (!in.is_open())
    {
        std::cout << "Can't open file: " << filename << std::endl;
        return 1;
    }

    // 4 - version
    readUINT32(in);
    // 16 - name
    readUINT32(in);
    readUINT32(in);
    readUINT32(in);
    readUINT32(in);
    // 4 - default position
    readUINT32(in);
    // 4 - default elevation
    readUINT32(in);
    // 4 - default orientation
    readUINT32(in);
    // 4 - local vars
    uint32_t localVars = readUINT32(in);
    // 4 - SID
    readUINT32(in);
    // 4 - flags
    uint32_t flags = readUINT32(in);
    // 4 - elevations
    uint32_t elevations = 0;
    if ((flags & 2) == 0) elevations++;
    if ((flags & 4) == 0) elevations++;
    if ((flags & 8) == 0) elevations++;

    // 4 - unknown
    readUINT32(in);
    // 4 - global vars
    uint32_t globalVars = readUINT32(in);
    // 4 - map id
    readUINT32(in);
    // 4 - time
    readUINT32(in);
    // 4*44 - unknown
    for (unsigned i = 0; i != 44; ++i) readUINT32(in);
    // 4 * NUM-GLOBAL-VARS
    for (unsigned i = 0; i != globalVars; ++i) readUINT32(in);
    // 4 * NUM-LOCAL-VARS
    for (unsigned i = 0; i != localVars; ++i) readUINT32(in);
    // 100*100 * 2 * 2 * elevations  - tiles
    for (unsigned i = 0; i != 100*100*elevations; ++i) readUINT32(in);

    // SCRIPTS SECTION
    for (unsigned int i = 0; i < 5; i++)
    {
        uint32_t count = readUINT32(in);
        if (count > 0)
        {
            short loop = count;
            if (count%16 > 0 ) loop += 16 - count%16;

            unsigned int check = 0;
            for (unsigned short j = 0; j < loop; j++)
            {
                {
                    uint32_t PID = readUINT32(in);

                    readUINT32(in); // unknown1

                    switch ((PID & 0xFF000000) >> 24)
                    {
                        case 1:
                            readUINT32(in); //unknown 2
                            readUINT32(in); //unknown 3
                            break;
                        case 2:
                            readUINT32(in); //unknown 2
                            break;
                        default:
                            break;
                    }
                    readUINT32(in); //unknown 4
                    readUINT32(in); // scriptId
                    readUINT32(in); //unknown 5
                    readUINT32(in); //unknown 6
                    readUINT32(in); //unknown 7
                    readUINT32(in); //unknown 8
                    readUINT32(in); //unknown 9
                    readUINT32(in); //unknown 10
                    readUINT32(in); //unknown 11
                    readUINT32(in); //unknown 12
                    readUINT32(in); //unknown 13
                    readUINT32(in); //unknown 14
                    readUINT32(in); //unknown 15
                    readUINT32(in); //unknown 16

                    if (j < count)
                    {
                        //std::cout << "Map script: 0x" << std::hex << script->PID() << std::endl;
                    }

                }
                if ((j % 16) == 15)
                {
                    uint32_t v = readUINT32(in);
                    check += v;

                    readUINT32(in); // skip 4
                }
            }
            if (check != count)
            {
                std::cout << "Check error!" << std::endl;
                return 1;
            }
        }
    }

    // OBJECTS section
    uint32_t objectsTotal = readUINT32(in);

    //std::cout << "Objects: " << objectsTotal << std::endl;

    for (unsigned int i = 0; i != elevations; ++i)
        {
            uint32_t objectsOnElevation = readUINT32(in);
            for (unsigned int j = 0; j != objectsOnElevation; ++j)
            {
                readObject(in);
            }
        }


    in.close();
    return 0;
}